

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  CMUnitTest test_1;
  CMUnitTest test;
  CMUnitTest tests [59];
  roaring_add_offset_test_state_t state_1;
  int64_t offset_1;
  roaring_add_offset_test_state_t state;
  int64_t offset;
  roaring_add_offset_test_state_t roaring_state [50];
  size_t j;
  size_t i;
  uint32_t dense_bitmap [25005];
  uint32_t sparse_bitmap [5];
  container_add_offset_test_state_t container_state [9];
  uint16_t v;
  uint16_t i_1;
  undefined1 auStackY_1a1c8 [4];
  char *in_stack_fffffffffffe5e40;
  char *in_stack_fffffffffffe5e48;
  unsigned_long in_stack_fffffffffffe5e50;
  undefined8 uStack_1a1a0;
  code *pcStack_1a198;
  code *pcStack_1a190;
  code *pcStack_1a188;
  undefined8 *puStack_1a180;
  undefined1 auStack_1a178 [48];
  CMFixtureFunction in_stack_fffffffffffe5eb8;
  CMFixtureFunction in_stack_fffffffffffe5ec0;
  size_t in_stack_fffffffffffe5ec8;
  CMUnitTest *in_stack_fffffffffffe5ed0;
  char *in_stack_fffffffffffe5ed8;
  char *pcStack_19838;
  undefined4 *puStack_19830;
  undefined8 uStack_19828;
  long lStack_19820;
  undefined8 uStack_19818;
  undefined8 uStack_19810;
  undefined8 uStack_19808;
  undefined8 uStack_19800;
  undefined8 uStack_197f8;
  long lStack_197f0;
  char *pcStack_197e8;
  undefined4 *puStack_197e0;
  undefined8 uStack_197d8;
  long lStack_197d0;
  undefined8 uStack_197c8;
  undefined8 uStack_197c0;
  undefined8 uStack_197b8;
  undefined8 uStack_197b0;
  undefined8 uStack_197a8;
  long lStack_197a0;
  char *apcStack_19798 [450];
  ulong uStack_18988;
  ulong uStack_18980;
  undefined4 auStack_18978 [25008];
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined4 local_2a8;
  undefined8 local_298 [82];
  uint16_t local_8;
  ushort local_6;
  undefined4 local_4;
  
  local_4 = 0;
  tellmeall();
  local_8 = 100;
  for (local_6 = 0; local_6 < 900; local_6 = local_6 + 1) {
    main::range_100_1000[local_6] = local_8;
    local_8 = local_8 + 1;
  }
  memcpy(local_298,&PTR_anon_var_dwarf_15b_00182b50,0x288);
  pcVar1 = _auStackY_1a1c8;
  local_2b8 = 0x83ba000015cc;
  local_2b0 = 0xdfbc0000abff;
  local_2a8 = 0x14499;
  uStack_18980 = 3;
  for (uStack_18988 = 100000; uStack_18988 < 200000; uStack_18988 = uStack_18988 + 4) {
    auStack_18978[uStack_18980] = (int)uStack_18988;
    uStack_18980 = uStack_18980 + 1;
  }
  lVar3 = uStack_18980 + 1;
  auStack_18978[uStack_18980] = 400000;
  uStack_18980 = uStack_18980 + 2;
  auStack_18978[lVar3] = 1400000;
  iVar2 = (int)((ulong)_auStackY_1a1c8 >> 0x20);
  _assert_true(in_stack_fffffffffffe5e50,in_stack_fffffffffffe5e48,in_stack_fffffffffffe5e40,iVar2);
  _auStackY_1a1c8 = pcVar1;
  memset(apcStack_19798,0,0xe10);
  apcStack_19798[0] = "roaring_sparse_bitmap_offset_0";
  apcStack_19798[1] = (char *)&local_2b8;
  apcStack_19798[2] = (char *)0x5;
  apcStack_19798[9] = "roaring_sparse_bitmap_offset_100";
  apcStack_19798[10] = (char *)&local_2b8;
  apcStack_19798[0xb] = (char *)0x5;
  apcStack_19798[0xc] = (char *)0x64;
  apcStack_19798[0x12] = "roaring_sparse_bitmap_offset_25000";
  apcStack_19798[0x13] = (char *)&local_2b8;
  apcStack_19798[0x14] = (char *)0x5;
  apcStack_19798[0x15] = (char *)0x61a8;
  apcStack_19798[0x1b] = "roaring_sparse_bitmap_offset_83097";
  apcStack_19798[0x1c] = (char *)&local_2b8;
  apcStack_19798[0x1d] = (char *)0x5;
  apcStack_19798[0x1e] = (char *)0x14499;
  apcStack_19798[0x24] = "roaring_sparse_bitmap_offset_UINT32_MAX";
  apcStack_19798[0x25] = (char *)&local_2b8;
  apcStack_19798[0x26] = (char *)0x5;
  apcStack_19798[0x27] = (char *)0xffffffff;
  apcStack_19798[0x2d] = "roaring_sparse_bitmap_offset_UINT32_MAX - UINT16_MAX";
  apcStack_19798[0x2e] = (char *)&local_2b8;
  apcStack_19798[0x2f] = (char *)0x5;
  apcStack_19798[0x30] = (char *)0xffff0000;
  apcStack_19798[0x36] = "roaring_sparse_bitmap_offset_UINT32_MAX - UINT16_MAX + 1";
  apcStack_19798[0x37] = (char *)&local_2b8;
  apcStack_19798[0x38] = (char *)0x5;
  apcStack_19798[0x39] = (char *)0xffff0001;
  apcStack_19798[0x3f] = "roaring_sparse_bitmap_offset_((uint64_t)1) << 50";
  apcStack_19798[0x40] = (char *)&local_2b8;
  apcStack_19798[0x41] = (char *)0x5;
  apcStack_19798[0x42] = (char *)0x4000000000000;
  apcStack_19798[0x48] = "roaring_sparse_bitmap_offset_281474976710657L";
  apcStack_19798[0x49] = (char *)&local_2b8;
  apcStack_19798[0x4a] = (char *)0x5;
  apcStack_19798[0x4b] = (char *)0x1000000000001;
  uStack_18980 = 9;
  for (lStack_197a0 = 3; lStack_197a0 < 1000000; lStack_197a0 = lStack_197a0 * 3) {
    pcStack_197e8 = "roaring_dense_bitmap_offset_offset";
    puStack_197e0 = auStack_18978;
    uStack_197d8 = 0x61ad;
    lStack_197d0 = lStack_197a0;
    uStack_197c8 = 0;
    uStack_197c0 = 0;
    uStack_197b8 = 0;
    uStack_197b0 = 0;
    uStack_197a8 = 0;
    lVar3 = uStack_18980 * 9;
    uStack_18980 = uStack_18980 + 1;
    memcpy(apcStack_19798 + lVar3,&pcStack_197e8,0x48);
  }
  for (lStack_197f0 = 0x400; pcVar1 = _auStackY_1a1c8, lStack_197f0 < 1000000;
      lStack_197f0 = lStack_197f0 << 1) {
    pcStack_19838 = "roaring_dense_bitmap_offset_offset";
    puStack_19830 = auStack_18978;
    uStack_19828 = 0x61ad;
    lStack_19820 = lStack_197f0;
    uStack_19818 = 0;
    uStack_19810 = 0;
    uStack_19808 = 0;
    uStack_19800 = 0;
    uStack_197f8 = 0;
    lVar3 = uStack_18980 * 9;
    uStack_18980 = uStack_18980 + 1;
    memcpy(apcStack_19798 + lVar3,&pcStack_19838,0x48);
  }
  iVar2 = (int)((ulong)_auStackY_1a1c8 >> 0x20);
  _assert_true(in_stack_fffffffffffe5e50,in_stack_fffffffffffe5e48,in_stack_fffffffffffe5e40,iVar2);
  _auStackY_1a1c8 = pcVar1;
  uStack_18988 = 0;
  uStack_18980 = 0;
  memset(auStack_1a178,0,0x938);
  for (; uStack_18980 < 9; uStack_18980 = uStack_18980 + 1) {
    uStack_1a1a0 = local_298[uStack_18980 * 9];
    pcStack_1a198 = container_add_offset_test;
    pcStack_1a190 = setup_container_add_offset_test;
    pcStack_1a188 = teardown_container_add_offset_test;
    puStack_1a180 = local_298 + uStack_18980 * 9;
    memcpy(auStack_1a178 + uStack_18980 * 0x28,&uStack_1a1a0,0x28);
  }
  for (; uStack_18988 < 0x32; uStack_18988 = uStack_18988 + 1) {
    _auStackY_1a1c8 = apcStack_19798[uStack_18988 * 9];
    memcpy(auStack_1a178 + uStack_18980 * 0x28,auStackY_1a1c8,0x28);
    uStack_18980 = uStack_18980 + 1;
  }
  iVar2 = _cmocka_run_group_tests
                    (in_stack_fffffffffffe5ed8,in_stack_fffffffffffe5ed0,in_stack_fffffffffffe5ec8,
                     in_stack_fffffffffffe5ec0,in_stack_fffffffffffe5eb8);
  return iVar2;
}

Assistant:

int main() {
    tellmeall();

    static uint16_t range_100_1000[900];
    for (uint16_t i = 0, v = 100; i < 900; i++, v++) {
        range_100_1000[i] = v;
    }
    container_add_offset_test_state_t container_state[] = {
        BITSET_ADD_OFFSET_TEST_CASE(range_100_1000, 123),
        BITSET_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX),
        BITSET_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX - 500),
        ARRAY_ADD_OFFSET_TEST_CASE(range_100_1000, 123),
        ARRAY_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX),
        ARRAY_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX - 500),
        RUN_ADD_OFFSET_TEST_CASE(range_100_1000, 123),
        RUN_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX),
        RUN_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX - 500),
    };

    uint32_t sparse_bitmap[] = {5580, 33722, 44031, 57276, 83097};
    uint32_t dense_bitmap[5 + (200000 - 100000) / 4];
    size_t i, j;

    i = 0;
    dense_bitmap[i++] = 10;
    dense_bitmap[i++] = UINT16_MAX;
    dense_bitmap[i++] = 0x010101;
    for (j = 100000; j < 200000; j += 4) {
        dense_bitmap[i++] = j;
    }
    dense_bitmap[i++] = 400000;
    dense_bitmap[i++] = 1400000;

    assert_true(i == ARRAY_SIZE(dense_bitmap));

    // NB: only add positive offsets, the test function takes care of also
    // running a negative test for that offset.
    roaring_add_offset_test_state_t roaring_state[50] = {
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 0),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 100),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 25000),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 83097),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, UINT32_MAX),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, UINT32_MAX - UINT16_MAX),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap,
                                     UINT32_MAX - UINT16_MAX + 1),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, ((uint64_t)1) << 50),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 281474976710657L),
    };
    i = 9;
    for (int64_t offset = 3; offset < 1000000; offset *= 3) {
        roaring_add_offset_test_state_t state =
            ROARING_ADD_OFFSET_TEST_CASE(dense_bitmap, offset);
        roaring_state[i++] = state;
    }
    for (int64_t offset = 1024; offset < 1000000; offset *= 2) {
        roaring_add_offset_test_state_t state =
            ROARING_ADD_OFFSET_TEST_CASE(dense_bitmap, offset);
        roaring_state[i++] = state;
    }
    assert_true(i <= ARRAY_SIZE(roaring_state));

    i = j = 0;
    struct CMUnitTest
        tests[ARRAY_SIZE(container_state) + ARRAY_SIZE(roaring_state)];
    memset(tests, 0, sizeof(tests));
    for (; i < ARRAY_SIZE(container_state); i++) {
        struct CMUnitTest test = CONTAINER_ADD_OFFSET_TEST(container_state[i]);
        tests[i] = test;
    }
    for (; j < ARRAY_SIZE(roaring_state); i++, j++) {
        struct CMUnitTest test = ROARING_ADD_OFFSET_TEST(roaring_state[j]);
        tests[i] = test;
    }

    return cmocka_run_group_tests(tests, NULL, NULL);
}